

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O2

void err_state_free(void *statep)

{
  ERR_STATE *state;
  long lVar1;
  
  if (statep != (void *)0x0) {
    for (lVar1 = 0; lVar1 != 0x180; lVar1 = lVar1 + 0x18) {
      err_clear((err_error_st *)((long)statep + lVar1));
    }
    free(*(void **)((long)statep + 0x188));
    free(statep);
    return;
  }
  return;
}

Assistant:

static void err_state_free(void *statep) {
  ERR_STATE *state = reinterpret_cast<ERR_STATE *>(statep);

  if (state == NULL) {
    return;
  }

  for (unsigned i = 0; i < ERR_NUM_ERRORS; i++) {
    err_clear(&state->errors[i]);
  }
  free(state->to_free);
  free(state);
}